

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
texImage3DCallback(int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
                  void *pixels,void *userdata)

{
  GLenum GVar1;
  GLsizei in_ECX;
  GLsizei in_EDX;
  int in_ESI;
  GLint in_EDI;
  GLsizei in_R8D;
  void *in_stack_00000008;
  int *in_stack_00000010;
  ktx_cbdata *cbData;
  GLsizei local_5c;
  ktx_error_code_e local_14;
  
  if (gl.glTexImage3D == (PFNGLTEXIMAGE3DPROC)0x0) {
    __assert_fail("gl.glTexImage3D != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                  ,0x25c,
                  "ktx_error_code_e texImage3DCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                 );
  }
  local_5c = in_R8D;
  if (in_stack_00000010[5] != 0) {
    local_5c = in_stack_00000010[5];
  }
  (*gl.glTexImage3D)(*in_stack_00000010 + in_ESI,in_EDI,in_stack_00000010[2],in_EDX,in_ECX,local_5c,
                     0,in_stack_00000010[1],in_stack_00000010[3],in_stack_00000008);
  GVar1 = (*gl.glGetError)();
  in_stack_00000010[4] = GVar1;
  if (GVar1 == 0) {
    local_14 = KTX_SUCCESS;
  }
  else {
    local_14 = KTX_GL_ERROR;
  }
  return local_14;
}

Assistant:

KTX_error_code
texImage3DCallback(int miplevel, int face,
                   int width, int height,
                   int depth,
                   ktx_uint64_t faceLodSize,
                   void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    UNUSED(faceLodSize);

    assert(gl.glTexImage3D != NULL);
    gl.glTexImage3D(cbData->glTarget + face, miplevel,
                   cbData->glInternalformat,
                   width, height,
                   cbData->numLayers == 0 ? (GLuint)depth : cbData->numLayers,
                   0,
                   cbData->glFormat, cbData->glType, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}